

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktxapp.h
# Opt level: O2

bool __thiscall
ktxApp::loadFileList
          (ktxApp *this,string *f,bool relativize,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *filenames)

{
  int iVar1;
  FILE *__stream;
  long lVar2;
  char *pcVar3;
  int *piVar4;
  bool bVar5;
  string listName;
  string readFilename;
  string dirname;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1058;
  char buf [4096];
  
  std::__cxx11::string::string((string *)&listName,(string *)f);
  std::__cxx11::string::erase((ulong)&listName,0);
  std::__cxx11::string::string<std::allocator<char>>((string *)buf,"r",(allocator<char> *)&dirname);
  __stream = fopen(listName._M_dataplus._M_p,(char *)CONCAT71(buf._1_7_,buf[0]));
  std::__cxx11::string::~string((string *)buf);
  if (__stream == (FILE *)0x0) {
    piVar4 = __errno_location();
    pcVar3 = strerror(*piVar4);
    bVar5 = false;
    error(this,"failed opening filename list: \"%s\": %s\n",listName._M_dataplus._M_p,pcVar3);
    goto LAB_00106cc9;
  }
  dirname._M_dataplus._M_p = (pointer)&dirname.field_2;
  dirname._M_string_length = 0;
  dirname.field_2._M_local_buf[0] = '\0';
  if (relativize) {
    lVar2 = std::__cxx11::string::rfind((char)&listName,0x2f);
    if (lVar2 == -1) goto LAB_00106b5f;
    std::__cxx11::string::substr((ulong)buf,(ulong)&listName);
    std::__cxx11::string::operator=((string *)&dirname,(string *)buf);
    std::__cxx11::string::~string((string *)buf);
    bVar5 = true;
  }
  else {
LAB_00106b5f:
    bVar5 = false;
  }
  while( true ) {
    buf[0] = '\0';
    pcVar3 = fgets(buf,0x1000,__stream);
    if (pcVar3 == (char *)0x0) break;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&readFilename,pcVar3,(allocator<char> *)&local_1058);
    while ((readFilename._M_string_length != 0 && (*readFilename._M_dataplus._M_p == ' '))) {
      std::__cxx11::string::erase((ulong)&readFilename,0);
    }
    while (readFilename._M_string_length != 0) {
      if ((0x20 < (ulong)(byte)readFilename._M_dataplus._M_p[readFilename._M_string_length - 1]) ||
         ((0x100002400U >>
           ((ulong)(byte)readFilename._M_dataplus._M_p[readFilename._M_string_length - 1] & 0x3f) &
          1) == 0)) {
        if (bVar5) {
          std::operator+(&local_1058,&dirname,&readFilename);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)filenames,
                     &local_1058);
          std::__cxx11::string::~string((string *)&local_1058);
        }
        else {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(filenames,&readFilename);
        }
        break;
      }
      std::__cxx11::string::erase((ulong)&readFilename,readFilename._M_string_length - 1);
    }
    std::__cxx11::string::~string((string *)&readFilename);
  }
  iVar1 = ferror(__stream);
  bVar5 = iVar1 == 0;
  if (!bVar5) {
    piVar4 = __errno_location();
    pcVar3 = strerror(*piVar4);
    error(this,"failed reading filename list: \"%s\": %s\n",listName._M_dataplus._M_p,pcVar3);
  }
  fclose(__stream);
  std::__cxx11::string::~string((string *)&dirname);
LAB_00106cc9:
  std::__cxx11::string::~string((string *)&listName);
  return bVar5;
}

Assistant:

bool loadFileList(const string &f, bool relativize,
                      vector<string>& filenames)
    {
        string listName(f);
        listName.erase(0, relativize ? 2 : 1);

        FILE *lf = nullptr;
        lf = fopenUTF8(listName, "r");
        if (!lf) {
            error("failed opening filename list: \"%s\": %s\n",
                  listName.c_str(), strerror(errno));
            return false;
        }

        string dirname;

        if (relativize) {
            size_t dirnameEnd = listName.find_last_of('/');
            if (dirnameEnd == string::npos) {
                relativize = false;
            } else {
                dirname = listName.substr(0, dirnameEnd + 1);
            }
        }

        for (;;) {
            // Cross platform PATH_MAX def is too much trouble!
            char buf[4096];
            buf[0] = '\0';

            char *p = fgets(buf, sizeof(buf), lf);
            if (!p) {
              if (ferror(lf)) {
                error("failed reading filename list: \"%s\": %s\n",
                      listName.c_str(), strerror(errno));
                fclose(lf);
                return false;
              } else
                break;
            }

            string readFilename(p);
            while (readFilename.size()) {
                if (readFilename[0] == ' ')
                  readFilename.erase(0, 1);
                else
                  break;
            }

            while (readFilename.size()) {
                const char c = readFilename.back();
                if ((c == ' ') || (c == '\n') || (c == '\r'))
                  readFilename.erase(readFilename.size() - 1, 1);
                else
                  break;
            }

            if (readFilename.size()) {
                if (relativize)
                    filenames.push_back(dirname + readFilename);
                else
                    filenames.push_back(readFilename);
            }
        }

        fclose(lf);

        return true;
    }